

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlCDataSection(ostream *stream,char *data)

{
  char *pcVar1;
  char *next_segment;
  char *segment;
  char *data_local;
  ostream *stream_local;
  
  std::operator<<(stream,"<![CDATA[");
  next_segment = data;
  while( true ) {
    pcVar1 = strstr(next_segment,"]]>");
    if (pcVar1 == (char *)0x0) break;
    std::ostream::write((char *)stream,(long)next_segment);
    std::operator<<(stream,"]]>]]&gt;<![CDATA[");
    next_segment = pcVar1 + 3;
  }
  std::operator<<(stream,next_segment);
  std::operator<<(stream,"]]>");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlCDataSection(::std::ostream* stream,
                                                     const char* data) {
  const char* segment = data;
  *stream << "<![CDATA[";
  for (;;) {
    const char* const next_segment = strstr(segment, "]]>");
    if (next_segment != NULL) {
      stream->write(
          segment, static_cast<std::streamsize>(next_segment - segment));
      *stream << "]]>]]&gt;<![CDATA[";
      segment = next_segment + strlen("]]>");
    } else {
      *stream << segment;
      break;
    }
  }
  *stream << "]]>";
}